

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxTrackBuilder.cpp
# Opt level: O1

void __thiscall FluxTrackBuilder::addRawBit(FluxTrackBuilder *this,bool next_bit)

{
  iterator iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uint local_24;
  
  uVar2 = this->m_flux_time + this->m_bitcell_ns;
  this->m_flux_time = uVar2;
  if (this->m_curr_bit == true) {
    if (*(int *)&(this->super_TrackBuilder).field_0x14 < 0x28) {
      iVar1._M_current =
           (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_flux_times,iVar1,
                   &this->m_flux_time);
      }
      else {
        *iVar1._M_current = uVar2;
        (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      uVar5 = 0;
    }
    else {
      iVar3 = -0xf0;
      if (this->m_last_bit != false) {
        iVar3 = 0xf0;
      }
      iVar4 = 0;
      if (this->m_last_bit != next_bit) {
        iVar4 = iVar3;
      }
      iVar1._M_current =
           (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&this->m_flux_times,iVar1,&local_24);
      }
      else {
        *iVar1._M_current = uVar2 + iVar4;
        (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      uVar5 = -iVar4;
    }
    this->m_flux_time = uVar5;
  }
  this->m_last_bit = this->m_curr_bit;
  this->m_curr_bit = next_bit;
  return;
}

Assistant:

void FluxTrackBuilder::addRawBit(bool next_bit)
{
    m_flux_time += m_bitcell_ns;

    if (m_curr_bit)
    {
        if (m_cylhead.cyl < 40)
        {
            m_flux_times.push_back(m_flux_time);
            m_flux_time = 0;
        }
        else
        {
            // Move adjacent transitions further apart, to account for attraction when written.
            auto pre_comp_ns{ (m_last_bit == next_bit) ? 0 : (m_last_bit ? +PRECOMP_NS : -PRECOMP_NS) };

            m_flux_times.push_back(m_flux_time + pre_comp_ns);
            m_flux_time = 0 - pre_comp_ns;
        }
    }

    m_last_bit = m_curr_bit;
    m_curr_bit = next_bit;
}